

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

void print_snifline(int slot)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int in_EDI;
  int j;
  int i;
  canid_t cid;
  int dlc_diff;
  long diffusec;
  long diffsec;
  int local_28;
  int local_24;
  long local_18;
  long local_10;
  
  local_10 = sniftab[in_EDI].currstamp.tv_sec - sniftab[in_EDI].laststamp.tv_sec;
  local_18 = sniftab[in_EDI].currstamp.tv_usec - sniftab[in_EDI].laststamp.tv_usec;
  iVar2 = (uint)sniftab[in_EDI].last.len - (uint)sniftab[in_EDI].current.len;
  uVar1 = sniftab[in_EDI].current.can_id;
  if (local_18 < 0) {
    local_10 = local_10 + -1;
    local_18 = local_18 + 1000000;
  }
  if (local_10 < 0) {
    local_18 = 0;
    local_10 = 0;
  }
  if (99 < local_10) {
    local_10 = 99;
    local_18 = 999999;
  }
  if ((uVar1 & 0x80000000) == 0) {
    if (print_eff == 0) {
      printf("%02ld%03ld%s%03X%s",local_10,local_18 / 1000,ldl,(ulong)(uVar1 & 0x7ff),ldl);
    }
    else {
      printf("%02ld%03ld%s---- %03X%s",local_10,local_18 / 1000,vdl,(ulong)(uVar1 & 0x7ff),vdl);
    }
  }
  else {
    printf("%02ld%03ld%s%08X%s",local_10,local_18 / 1000,vdl,(ulong)(uVar1 & 0x1fffffff),vdl);
  }
  if (binary == '\0') {
    for (local_24 = 0; local_24 < (int)(uint)sniftab[in_EDI].current.len; local_24 = local_24 + 1) {
      if ((color == '\0') ||
         ((*(byte *)((long)in_EDI * 0x158 + 0x107250 + (long)local_24) &
          (*(byte *)((long)in_EDI * 0x158 + 0x107298 + (long)local_24) ^ 0xff)) == 0)) {
        printf("%02X ");
      }
      else {
        printf("%s%02X%s ","\x1b[1m\x1b[31m",
               (ulong)*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24),"\x1b[0m");
      }
    }
    if (print_ascii == 0) {
      for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
        printf("   ");
      }
    }
    else {
      if ((int)(uint)sniftab[in_EDI].current.len < max_dlen) {
        printf("%*s",(ulong)((max_dlen - (uint)sniftab[in_EDI].current.len) * 3),"");
      }
      for (local_24 = 0; local_24 < (int)(uint)sniftab[in_EDI].current.len; local_24 = local_24 + 1)
      {
        if ((*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24) < 0x20) ||
           (0x7e < *(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24))) {
          putchar(0x2e);
        }
        else if ((color == '\0') ||
                ((*(byte *)((long)in_EDI * 0x158 + 0x107250 + (long)local_24) &
                 (*(byte *)((long)in_EDI * 0x158 + 0x107298 + (long)local_24) ^ 0xff)) == 0)) {
          putchar((uint)*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24));
        }
        else {
          printf("%s%c%s","\x1b[1m\x1b[31m",
                 (ulong)*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24),"\x1b[0m");
        }
      }
      for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
        putchar(0x20);
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < (int)(uint)sniftab[in_EDI].current.len; local_24 = local_24 + 1) {
      for (local_28 = 7; -1 < local_28; local_28 = local_28 + -1) {
        bVar3 = (byte)local_28;
        if (((color == '\0') ||
            (((uint)*(byte *)((long)in_EDI * 0x158 + 0x107250 + (long)local_24) &
             1 << (bVar3 & 0x1f)) == 0)) ||
           (((uint)*(byte *)((long)in_EDI * 0x158 + 0x107298 + (long)local_24) & 1 << (bVar3 & 0x1f)
            ) != 0)) {
          if (((uint)*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24) &
              1 << (bVar3 & 0x1f)) == 0) {
            putchar(0x30);
          }
          else {
            putchar(0x31);
          }
        }
        else if (((uint)*(byte *)((long)in_EDI * 0x158 + 0x107208 + (long)local_24) &
                 1 << (bVar3 & 0x1f)) == 0) {
          printf("%s0%s","\x1b[1m\x1b[31m","\x1b[0m");
        }
        else {
          printf("%s1%s","\x1b[1m\x1b[31m","\x1b[0m");
        }
      }
      if (binary_gap != '\0') {
        putchar(0x20);
      }
    }
    for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
      printf("        ");
      if (binary_gap != '\0') {
        putchar(0x20);
      }
    }
  }
  putchar(10);
  memset(sniftab[in_EDI].marker.data,0,(long)max_dlen);
  return;
}

Assistant:

void print_snifline(int slot)
{
	long diffsec  = sniftab[slot].currstamp.tv_sec  - sniftab[slot].laststamp.tv_sec;
	long diffusec = sniftab[slot].currstamp.tv_usec - sniftab[slot].laststamp.tv_usec;
	int dlc_diff  = sniftab[slot].last.len - sniftab[slot].current.len;
	canid_t cid = sniftab[slot].current.can_id;
	int i,j;

	if (diffusec < 0)
		diffsec--, diffusec += 1000000;

	if (diffsec < 0)
		diffsec = diffusec = 0;

	if (diffsec >= 100)
		diffsec = 99, diffusec = 999999;

	if (cid & CAN_EFF_FLAG)
		printf("%02ld%03ld%s%08X%s", diffsec, diffusec/1000, vdl, cid & CAN_EFF_MASK, vdl);
	else if (print_eff)
		printf("%02ld%03ld%s---- %03X%s", diffsec, diffusec/1000, vdl, cid & CAN_SFF_MASK, vdl);
	else
		printf("%02ld%03ld%s%03X%s", diffsec, diffusec/1000, ldl, cid & CAN_SFF_MASK, ldl);

	if (binary) {
		for (i = 0; i < sniftab[slot].current.len; i++) {
			for (j=7; j >= 0; j--) {
				if ((color) && (sniftab[slot].marker.data[i] & 1<<j) &&
				    (!(sniftab[slot].notch.data[i] & 1<<j)))
					if (sniftab[slot].current.data[i] & 1<<j)
						printf("%s1%s", ATTCOLOR, ATTRESET);
					else
						printf("%s0%s", ATTCOLOR, ATTRESET);
				else
					if (sniftab[slot].current.data[i] & 1<<j)
						putchar('1');
					else
						putchar('0');
			}
			if (binary_gap)
				putchar(' ');
		}

		/*
		 * when the len decreased (dlc_diff > 0),
		 * we need to blank the former data printout
		 */
		for (i = 0; i < dlc_diff; i++) {
			printf("        ");
			if (binary_gap)
				putchar(' ');
		}

	} else { /* not binary -> hex data and ASCII output */

		for (i = 0; i < sniftab[slot].current.len; i++)
			if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
				printf("%s%02X%s ", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
			else
				printf("%02X ", sniftab[slot].current.data[i]);

		if (print_ascii) {
			/* jump to common start for ASCII output */
			if (sniftab[slot].current.len < max_dlen)
				printf("%*s", (max_dlen - sniftab[slot].current.len) * 3, "");

			for (i = 0; i < sniftab[slot].current.len; i++)
				if ((sniftab[slot].current.data[i] > 0x1F) &&
				    (sniftab[slot].current.data[i] < 0x7F))
					if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
						printf("%s%c%s", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
					else
						putchar(sniftab[slot].current.data[i]);
				else
					putchar('.');

			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				putchar(' ');
		} else {
			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				printf("   ");
		}
	}

	putchar('\n');

	memset(&sniftab[slot].marker.data, 0, max_dlen);
}